

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.cc
# Opt level: O1

int main(void)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  parameter_type P;
  vector<double,_std::allocator<double>_> x2;
  vector<double,_std::allocator<double>_> x1;
  vector<double,_std::allocator<double>_> x4;
  vector<double,_std::allocator<double>_> x3;
  correlated_normal_dist<double> D;
  lcg64 R;
  double sig [4] [4];
  result_type local_190;
  vector<double,_std::allocator<double>_> local_188;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_148;
  vector<double,_std::allocator<double>_> local_128;
  correlated_normal_dist<double> local_108;
  lcg64 local_d0;
  double local_b8 [16];
  double local_38;
  
  pdVar4 = (double *)&DAT_001031c0;
  pdVar5 = local_b8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar5 = pdVar5 + 1;
  }
  trng::correlated_normal_dist<double>::param_type::param_type<double_const*>
            (&local_108.P,local_b8,&local_38);
  local_108.normal_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.normal_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.normal_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64::lcg64(&local_d0,P);
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  iVar6 = 1000000;
  do {
    local_190 = trng::correlated_normal_dist<double>::operator()(&local_108,&local_d0);
    if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_168,
                 (iterator)
                 local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_190);
    }
    else {
      *local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = local_190;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_190 = trng::correlated_normal_dist<double>::operator()(&local_108,&local_d0);
    if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_188,
                 (iterator)
                 local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_190);
    }
    else {
      *local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = local_190;
      local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_190 = trng::correlated_normal_dist<double>::operator()(&local_108,&local_d0);
    if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_128,
                 (iterator)
                 local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_190);
    }
    else {
      *local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = local_190;
      local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_190 = trng::correlated_normal_dist<double>::operator()(&local_108,&local_d0);
    if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_148,
                 (iterator)
                 local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_190);
    }
    else {
      *local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = local_190;
      local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  *(undefined8 *)(erf + *(long *)(std::cout + -0x18)) = 4;
  dVar1 = covariance(&local_168,&local_168);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_168,&local_188);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_168,&local_128);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_168,&local_148);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_188,&local_168);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_188,&local_188);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_188,&local_128);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_188,&local_148);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_128,&local_168);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_128,&local_188);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_128,&local_128);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_128,&local_148);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_148,&local_168);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_148,&local_188);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_148,&local_128);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190._0_1_ = 9;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  dVar1 = covariance(&local_148,&local_148);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  local_190 = (result_type)CONCAT71(local_190._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_190,1);
  if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.normal_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.normal_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.P.H_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.P.H_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
  const int d{4};
  // covariance matrix
  const double sig[d][d]{{2.0, -0.5, 0.3, -0.3},
                         {-0.5, 3.0, -0.3, 0.3},
                         {0.3, -0.3, 1.0, -0.3},
                         {-0.3, 0.3, -0.3, 1.0}};
  trng::correlated_normal_dist<> D(&sig[0][0], &sig[d - 1][d - 1] + 1);
  trng::lcg64 R;

  std::vector<double> x1, x2, x3, x4;
  // generate 4-tuples of correlated normal variables
  for (int i{0}; i < 1000000; ++i) {
    x1.push_back(D(R));
    x2.push_back(D(R));
    x3.push_back(D(R));
    x4.push_back(D(R));
  }
  // print (empirical) covariance matrix
  std::cout << std::setprecision(4) << covariance(x1, x1) << '\t' << covariance(x1, x2) << '\t'
            << covariance(x1, x3) << '\t' << covariance(x1, x4) << '\n'
            << covariance(x2, x1) << '\t' << covariance(x2, x2) << '\t' << covariance(x2, x3)
            << '\t' << covariance(x2, x4) << '\n'
            << covariance(x3, x1) << '\t' << covariance(x3, x2) << '\t' << covariance(x3, x3)
            << '\t' << covariance(x3, x4) << '\n'
            << covariance(x4, x1) << '\t' << covariance(x4, x2) << '\t' << covariance(x4, x3)
            << '\t' << covariance(x4, x4) << '\n';
  return EXIT_SUCCESS;
}